

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereRightJoinLoop(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel)

{
  SrcItem *__src;
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int p2;
  long lVar4;
  Parse *pParse;
  Vdbe *p;
  WhereRightJoin *pWVar5;
  WhereLoop *pWVar6;
  Subquery *pSVar7;
  ulong uVar8;
  WhereTerm *pWVar9;
  Table *pTab;
  bool bVar10;
  int iVar11;
  int iVar12;
  Expr *pEVar13;
  WhereInfo *pWInfo_00;
  Op *pOVar14;
  Index *pIVar15;
  uint p4;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long in_FS_OFFSET;
  Expr *local_c0;
  SrcList sFrom;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pParse = pWInfo->pParse;
  p = pParse->pVdbe;
  pWVar5 = pLevel->pRJ;
  pWVar6 = pLevel->pWLoop;
  __src = pWInfo->pTabList->a + pLevel->iFrom;
  sFrom.a[0].u3._0_4_ = 0xaaaaaaaa;
  sFrom.a[0].u3._4_4_ = 0xaaaaaaaa;
  sFrom.a[0].u4._0_4_ = 0xaaaaaaaa;
  sFrom.a[0].u4._4_4_ = 0xaaaaaaaa;
  sFrom.a[0].u1.nRow = 0xaaaaaaaa;
  sFrom.a[0].u1._4_4_ = 0xaaaaaaaa;
  sFrom.a[0].u2._0_4_ = 0xaaaaaaaa;
  sFrom.a[0].u2._4_4_ = 0xaaaaaaaa;
  sFrom.a[0].fg = (anon_struct_4_19_bb8b771d_for_fg)0xaaaaaaaa;
  sFrom.a[0].iCursor = -0x55555556;
  sFrom.a[0].colUsed._0_4_ = 0xaaaaaaaa;
  sFrom.a[0].colUsed._4_4_ = 0xaaaaaaaa;
  sFrom.a[0].zAlias._0_4_ = 0xaaaaaaaa;
  sFrom.a[0].zAlias._4_4_ = 0xaaaaaaaa;
  sFrom.a[0].pSTab._0_4_ = 0xaaaaaaaa;
  sFrom.a[0].pSTab._4_4_ = 0xaaaaaaaa;
  sFrom._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sFrom.a[0].zName._0_4_ = 0xaaaaaaaa;
  sFrom.a[0].zName._4_4_ = 0xaaaaaaaa;
  uVar16 = 0;
  sqlite3VdbeExplain(pParse,'\x01',"RIGHT-JOIN %s");
  if (0 < iLevel) {
    lVar17 = 0;
    uVar16 = 0;
    do {
      bVar1 = (&pWInfo->a[0].iFrom)[lVar17];
      uVar16 = uVar16 | *(ulong *)(*(long *)((long)&pWInfo->a[0].pWLoop + lVar17) + 8);
      if ((pWInfo->pTabList->a[bVar1].fg.field_0x1 & 0x40) != 0) {
        pSVar7 = pWInfo->pTabList->a[bVar1].u4.pSubq;
        iVar12 = pSVar7->regResult;
        sqlite3VdbeAddOp3(p,0x4b,0,iVar12,iVar12 + pSVar7->pSelect->pEList->nExpr + -1);
      }
      sqlite3VdbeAddOp3(p,0x88,*(int *)((long)&pWInfo->a[0].iTabCur + lVar17),0,0);
      iVar12 = *(int *)((long)&pWInfo->a[0].iIdxCur + lVar17);
      if (iVar12 != 0) {
        sqlite3VdbeAddOp3(p,0x88,iVar12,0,0);
      }
      lVar17 = lVar17 + 0x70;
    } while ((ulong)(uint)iLevel * 0x70 - lVar17 != 0);
  }
  if ((((__src->fg).jointype & 0x40) == 0) && (0 < (pWInfo->sWC).nTerm)) {
    uVar8 = pWVar6->maskSelf;
    lVar18 = 0;
    lVar17 = 0;
    local_c0 = (Expr *)0x0;
    do {
      pWVar9 = (pWInfo->sWC).a;
      if (((*(ushort *)((long)&pWVar9->wtFlags + lVar18) & 0x8002) == 0) ||
         (bVar10 = true, *(short *)((long)&pWVar9->eOperator + lVar18) == 0x2000)) {
        if (((*(ulong *)((long)&pWVar9->prereqAll + lVar18) & ~(uVar16 | uVar8)) == 0) &&
           (pEVar13 = *(Expr **)((long)&pWVar9->pExpr + lVar18), (pEVar13->flags & 3) == 0)) {
          if (pEVar13 == (Expr *)0x0) {
            pEVar13 = (Expr *)0x0;
          }
          else {
            pEVar13 = exprDup(pParse->db,pEVar13,0,(EdupBuf *)0x0);
          }
          local_c0 = sqlite3ExprAnd(pParse,local_c0,pEVar13);
        }
        bVar10 = false;
      }
      if (bVar10) break;
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0x38;
    } while (lVar17 < (pWInfo->sWC).nTerm);
  }
  else {
    local_c0 = (Expr *)0x0;
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  memcpy(sFrom.a,__src,0x48);
  sFrom.a[0].fg = (anon_struct_4_19_bb8b771d_for_fg)((uint)sFrom.a[0].fg & 0xffffff00);
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + '\x01';
  pWInfo_00 = sqlite3WhereBegin(pParse,&sFrom,local_c0,(ExprList *)0x0,(ExprList *)0x0,(Select *)0x0
                                ,0x1000,0);
  if (pWInfo_00 != (WhereInfo *)0x0) {
    iVar11 = pLevel->iTabCur;
    iVar3 = pParse->nMem;
    iVar12 = iVar3 + 1;
    pParse->nMem = iVar12;
    p2 = pWInfo_00->iContinue;
    pTab = __src->pSTab;
    if ((pTab->tabFlags & 0x80) == 0) {
      sqlite3VdbeAddOp3(p,0x87,iVar11,iVar12,0);
      p4 = 1;
    }
    else {
      for (pIVar15 = pTab->pIndex;
          (pIVar15 != (Index *)0x0 && ((*(ushort *)&pIVar15->field_0x63 & 3) != 2));
          pIVar15 = pIVar15->pNext) {
      }
      uVar2 = pIVar15->nKeyCol;
      pParse->nMem = iVar3 + (uint)uVar2;
      p4 = (uint)uVar2;
      if (uVar2 != 0) {
        uVar16 = 0;
        do {
          sqlite3ExprCodeGetColumnOfTable
                    (p,pTab,iVar11,(int)pIVar15->aiColumn[uVar16],iVar12 + (int)uVar16);
          uVar16 = uVar16 + 1;
          p4 = (uint)uVar2;
        } while ((uint)uVar2 != uVar16);
      }
    }
    iVar11 = sqlite3VdbeAddOp4Int(p,0x40,pWVar5->regBloom,0,iVar12,p4);
    sqlite3VdbeAddOp4Int(p,0x1d,pWVar5->iMatch,p2,iVar12,p4);
    if (p->db->mallocFailed == '\0') {
      pOVar14 = p->aOp + iVar11;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar14->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,10,pWVar5->regReturn,pWVar5->addrSubrtn,0);
    sqlite3WhereEnd(pWInfo_00);
  }
  if (local_c0 != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,local_c0);
  }
  if ((long)pParse->addrExplain == 0) {
    iVar12 = 0;
  }
  else {
    if (pParse->pVdbe->db->mallocFailed == '\0') {
      pOVar14 = pParse->pVdbe->aOp + pParse->addrExplain;
    }
    else {
      pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    iVar12 = pOVar14->p2;
  }
  pParse->addrExplain = iVar12;
  pParse->withinRJSubrtn = pParse->withinRJSubrtn + 0xff;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void sqlite3WhereRightJoinLoop(
  WhereInfo *pWInfo,
  int iLevel,
  WhereLevel *pLevel
){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  WhereRightJoin *pRJ = pLevel->pRJ;
  Expr *pSubWhere = 0;
  WhereClause *pWC = &pWInfo->sWC;
  WhereInfo *pSubWInfo;
  WhereLoop *pLoop = pLevel->pWLoop;
  SrcItem *pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
  SrcList sFrom;
  Bitmask mAll = 0;
  int k;

  ExplainQueryPlan((pParse, 1, "RIGHT-JOIN %s", pTabItem->pSTab->zName));
  sqlite3VdbeNoJumpsOutsideSubrtn(v, pRJ->addrSubrtn, pRJ->endSubrtn,
                                  pRJ->regReturn);
  for(k=0; k<iLevel; k++){
    int iIdxCur;
    SrcItem *pRight;
    assert( pWInfo->a[k].pWLoop->iTab == pWInfo->a[k].iFrom );
    pRight = &pWInfo->pTabList->a[pWInfo->a[k].iFrom];
    mAll |= pWInfo->a[k].pWLoop->maskSelf;
    if( pRight->fg.viaCoroutine ){
      Subquery *pSubq;
      assert( pRight->fg.isSubquery && pRight->u4.pSubq!=0 );
      pSubq = pRight->u4.pSubq;
      assert( pSubq->pSelect!=0 && pSubq->pSelect->pEList!=0 );
      sqlite3VdbeAddOp3(
          v, OP_Null, 0, pSubq->regResult,
          pSubq->regResult + pSubq->pSelect->pEList->nExpr-1
      );
    }
    sqlite3VdbeAddOp1(v, OP_NullRow, pWInfo->a[k].iTabCur);
    iIdxCur = pWInfo->a[k].iIdxCur;
    if( iIdxCur ){
      sqlite3VdbeAddOp1(v, OP_NullRow, iIdxCur);
    }
  }
  if( (pTabItem->fg.jointype & JT_LTORJ)==0 ){
    mAll |= pLoop->maskSelf;
    for(k=0; k<pWC->nTerm; k++){
      WhereTerm *pTerm = &pWC->a[k];
      if( (pTerm->wtFlags & (TERM_VIRTUAL|TERM_SLICE))!=0
       && pTerm->eOperator!=WO_ROWVAL
      ){
        break;
      }
      if( pTerm->prereqAll & ~mAll ) continue;
      if( ExprHasProperty(pTerm->pExpr, EP_OuterON|EP_InnerON) ) continue;
      pSubWhere = sqlite3ExprAnd(pParse, pSubWhere,
                                 sqlite3ExprDup(pParse->db, pTerm->pExpr, 0));
    }
  }
  sFrom.nSrc = 1;
  sFrom.nAlloc = 1;
  memcpy(&sFrom.a[0], pTabItem, sizeof(SrcItem));
  sFrom.a[0].fg.jointype = 0;
  assert( pParse->withinRJSubrtn < 100 );
  pParse->withinRJSubrtn++;
  pSubWInfo = sqlite3WhereBegin(pParse, &sFrom, pSubWhere, 0, 0, 0,
                                WHERE_RIGHT_JOIN, 0);
  if( pSubWInfo ){
    int iCur = pLevel->iTabCur;
    int r = ++pParse->nMem;
    int nPk;
    int jmp;
    int addrCont = sqlite3WhereContinueLabel(pSubWInfo);
    Table *pTab = pTabItem->pSTab;
    if( HasRowid(pTab) ){
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, -1, r);
      nPk = 1;
    }else{
      int iPk;
      Index *pPk = sqlite3PrimaryKeyIndex(pTab);
      nPk = pPk->nKeyCol;
      pParse->nMem += nPk - 1;
      for(iPk=0; iPk<nPk; iPk++){
        int iCol = pPk->aiColumn[iPk];
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iCur, iCol,r+iPk);
      }
    }
    jmp = sqlite3VdbeAddOp4Int(v, OP_Filter, pRJ->regBloom, 0, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeAddOp4Int(v, OP_Found, pRJ->iMatch, addrCont, r, nPk);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, jmp);
    sqlite3VdbeAddOp2(v, OP_Gosub, pRJ->regReturn, pRJ->addrSubrtn);
    sqlite3WhereEnd(pSubWInfo);
  }
  sqlite3ExprDelete(pParse->db, pSubWhere);
  ExplainQueryPlanPop(pParse);
  assert( pParse->withinRJSubrtn>0 );
  pParse->withinRJSubrtn--;
}